

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleButton::text(QString *__return_storage_ptr__,QAccessibleButton *this,Text t)

{
  qsizetype qVar1;
  bool bVar2;
  QObject *object;
  QPushButton *this_00;
  QWidget *this_01;
  QAbstractButton *pQVar3;
  char16_t *pcVar4;
  QTypedArrayData<char16_t> *tmp;
  Data *pDVar5;
  char16_t *tmp_1;
  char16_t *pcVar6;
  Data *pDVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (t == Name) {
    this_01 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    QWidget::accessibleName((QString *)&local_58,this_01);
    qVar1 = local_58.size;
    pcVar4 = local_58.ptr;
    pDVar7 = local_58.d;
    local_58.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar7;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (qVar1 != 0) goto LAB_004d69c4;
    pQVar3 = button(this);
    QAbstractButton::text((QString *)&local_70,pQVar3);
    qt_accStripAmp((QString *)&local_58,(QString *)&local_70);
LAB_004d694b:
    qVar1 = local_58.size;
    pcVar6 = local_58.ptr;
    pDVar5 = local_58.d;
    (__return_storage_ptr__->d).d = local_58.d;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.size = 0;
    local_58.d = pDVar7;
    local_58.ptr = pcVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    if (qVar1 != 0) goto LAB_004d69c4;
  }
  else {
    if (t == Accelerator) {
      object = (QObject *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      this_00 = QtPrivate::qobject_cast_helper<QPushButton*,QObject>(object);
      if ((this_00 == (QPushButton *)0x0) || (bVar2 = QPushButton::isDefault(this_00), !bVar2)) {
        pDVar7 = (Data *)0x0;
        pcVar4 = (char16_t *)0x0;
      }
      else {
        QKeySequence::QKeySequence((QKeySequence *)&local_70,0x1000005,0,0,0);
        QKeySequence::toString((SequenceFormat)&local_58);
        qVar1 = local_58.size;
        pcVar4 = local_58.ptr;
        pDVar7 = local_58.d;
        local_58.d = (Data *)0x0;
        (__return_storage_ptr__->d).d = pDVar7;
        (__return_storage_ptr__->d).ptr = local_58.ptr;
        local_58.ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = local_58.size;
        local_58.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        QKeySequence::~QKeySequence((QKeySequence *)&local_70);
        if (qVar1 != 0) goto LAB_004d69c4;
      }
      pQVar3 = button(this);
      QAbstractButton::text((QString *)&local_70,pQVar3);
      qt_accHotKey((QString *)&local_58,(QString *)&local_70);
      goto LAB_004d694b;
    }
    pDVar5 = (Data *)0x0;
    pcVar6 = (char16_t *)0x0;
  }
  QAccessibleWidget::text((QString *)&local_58,&this->super_QAccessibleWidget,t);
  (__return_storage_ptr__->d).d = local_58.d;
  (__return_storage_ptr__->d).ptr = local_58.ptr;
  (__return_storage_ptr__->d).size = local_58.size;
  local_58.size = 0;
  local_58.d = pDVar5;
  local_58.ptr = pcVar6;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_004d69c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAccessibleButton::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Accelerator:
    {
#if QT_CONFIG(shortcut) && QT_CONFIG(pushbutton)
        QPushButton *pb = qobject_cast<QPushButton*>(object());
        if (pb && pb->isDefault())
            str = QKeySequence(Qt::Key_Enter).toString(QKeySequence::NativeText);
#endif
        if (str.isEmpty())
            str = qt_accHotKey(button()->text());
    }
         break;
    case QAccessible::Name:
        str = widget()->accessibleName();
        if (str.isEmpty())
            str = qt_accStripAmp(button()->text());
        break;
    default:
        break;
    }
    if (str.isEmpty())
        str = QAccessibleWidget::text(t);
    return str;
}